

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

int set_command_and_move_old_owner_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_18;
  Am_Object cmd;
  Am_Object *self_local;
  
  cmd.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_18);
  pAVar2 = Am_Object::Get((Am_Object *)cmd.data,0xc5,0);
  Am_Object::operator=(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)cmd.data);
    Am_Object::Set(&local_18,0x170,pAVar3,1);
  }
  pAVar2 = Am_Object::Get((Am_Object *)cmd.data,0x195,0);
  Am_Object::operator=(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)cmd.data);
    Am_Object::Set(&local_18,0x170,pAVar3,1);
  }
  Am_Object::~Am_Object(&local_18);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_command_and_move_old_owner)
{
  Am_Object cmd;
  cmd = self.Get(Am_COMMAND);
  if (cmd.Valid())
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
  cmd = self.Get(Am_MOVE_GROW_COMMAND);
  if (cmd.Valid())
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
  return 1;
}